

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadField(BinaryReader *this,TypeMut *out_value)

{
  bool bVar1;
  Result RVar2;
  ulong uVar3;
  char *pcVar4;
  Enum EVar5;
  Enum EVar6;
  uint8_t mutable_;
  Type field_type;
  
  RVar2 = ReadType(this,&field_type,"field type");
  EVar5 = Error;
  if (RVar2.enum_ != Error) {
    bVar1 = IsConcreteType(this,field_type);
    if (bVar1) {
      mutable_ = '\0';
      RVar2 = ReadU8(this,&mutable_,"field mutability");
      EVar5 = Error;
      if (RVar2.enum_ != Error) {
        if (mutable_ < 2) {
          out_value->type = field_type;
          out_value->mutable_ = (bool)mutable_;
          EVar5 = Ok;
        }
        else {
          PrintError(this,"field mutability must be 0 or 1");
        }
      }
    }
    else {
      EVar6 = field_type.enum_;
      pcVar4 = "";
      if (EVar6 < Any) {
        pcVar4 = "-";
      }
      uVar3 = (ulong)(uint)-EVar6;
      if (Any < EVar6) {
        uVar3 = (ulong)field_type & 0xffffffff;
      }
      PrintError(this,"expected valid field type (got %s%#x)",pcVar4,uVar3);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReader::ReadField(TypeMut* out_value) {
  // TODO: Reuse for global header too?
  Type field_type;
  CHECK_RESULT(ReadType(&field_type, "field type"));
  ERROR_UNLESS(IsConcreteType(field_type),
               "expected valid field type (got " PRItypecode ")",
               WABT_PRINTF_TYPE_CODE(field_type));

  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadU8(&mutable_, "field mutability"));
  ERROR_UNLESS(mutable_ <= 1, "field mutability must be 0 or 1");
  out_value->type = field_type;
  out_value->mutable_ = mutable_;
  return Result::Ok;
}